

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void * arena_palloc(tsdn_t *tsdn,arena_t *arena,size_t usize,size_t alignment,_Bool zero,
                   tcache_t *tcache)

{
  cache_bin_stats_t *pcVar1;
  int iVar2;
  szind_t sVar3;
  arena_t *arena_00;
  void *pvVar4;
  size_t __n;
  int iVar5;
  ulong uVar6;
  cache_bin_t *tbin;
  _Bool local_39;
  tsd_t *local_38;
  
  if (0x3800 < usize) {
    if (alignment < 0x41) {
      pvVar4 = large_malloc(tsdn,arena,usize,zero);
      return pvVar4;
    }
LAB_001170b5:
    pvVar4 = large_palloc(tsdn,arena,usize,alignment,zero);
    return pvVar4;
  }
  if ((0xfff < alignment) && ((usize & 0xfff) != 0 || alignment != 0x1000)) goto LAB_001170b5;
  if (usize < 0x1001) {
    uVar6 = (ulong)sz_size2index_tab[usize + 7 >> 3];
  }
  else {
    sVar3 = sz_size2index_compute(usize);
    uVar6 = (ulong)sVar3;
  }
  if (tcache == (tcache_t *)0x0) {
    pvVar4 = arena_malloc_hard(tsdn,arena,usize,(szind_t)uVar6,zero);
    return pvVar4;
  }
  tbin = tcache->bins_small + uVar6;
  iVar2 = tcache->bins_small[uVar6].ncached;
  iVar5 = iVar2 + -1;
  tcache->bins_small[uVar6].ncached = iVar5;
  if ((tbin->low_water < iVar5) || (tbin->low_water = iVar5, iVar2 != 0)) {
    pvVar4 = tcache->bins_small[uVar6].avail[-iVar2];
  }
  else {
    tcache->bins_small[uVar6].ncached = 0;
    local_38 = &tsdn->tsd;
    arena_00 = arena_choose(&tsdn->tsd,arena);
    if ((arena_00 == (arena_t *)0x0) ||
       (pvVar4 = tcache_alloc_small_hard
                           ((tsdn_t *)local_38,arena_00,tcache,tbin,(szind_t)uVar6,&local_39),
       tsdn = (tsdn_t *)local_38, local_39 == false)) {
      return (void *)0x0;
    }
  }
  __n = sz_index2size_tab[uVar6];
  if (zero) {
LAB_001170d2:
    iVar5 = 0;
  }
  else {
    if (opt_junk_alloc != true) {
      if (opt_zero != true) goto LAB_00117069;
      goto LAB_001170d2;
    }
    __n = bin_infos[uVar6].reg_size;
    iVar5 = 0xa5;
  }
  memset(pvVar4,iVar5,__n);
LAB_00117069:
  pcVar1 = &tcache->bins_small[uVar6].tstats;
  pcVar1->nrequests = pcVar1->nrequests + 1;
  iVar5 = (tcache->gc_ticker).tick;
  (tcache->gc_ticker).tick = iVar5 + -1;
  if (iVar5 < 1) {
    (tcache->gc_ticker).tick = (tcache->gc_ticker).nticks;
    tcache_event_hard(&tsdn->tsd,tcache);
  }
  return pvVar4;
}

Assistant:

void *
arena_palloc(tsdn_t *tsdn, arena_t *arena, size_t usize, size_t alignment,
    bool zero, tcache_t *tcache) {
	void *ret;

	if (usize <= SC_SMALL_MAXCLASS
	    && (alignment < PAGE
	    || (alignment == PAGE && (usize & PAGE_MASK) == 0))) {
		/* Small; alignment doesn't require special slab placement. */
		ret = arena_malloc(tsdn, arena, usize, sz_size2index(usize),
		    zero, tcache, true);
	} else {
		if (likely(alignment <= CACHELINE)) {
			ret = large_malloc(tsdn, arena, usize, zero);
		} else {
			ret = large_palloc(tsdn, arena, usize, alignment, zero);
		}
	}
	return ret;
}